

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O1

void __thiscall Js::CompoundString::TakeOwnershipOfLastBlock(CompoundString *this)

{
  Type *addr;
  Recycler *recycler;
  code *pcVar1;
  bool bVar2;
  char16 *pcVar3;
  undefined4 *puVar4;
  Block *pBVar5;
  Block *pBVar6;
  
  pcVar3 = JavascriptString::UnsafeGetBuffer((JavascriptString *)this);
  if (pcVar3 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x3c5,"(!IsFinalized())","!IsFinalized()");
    if (!bVar2) goto LAB_00b384c7;
    *puVar4 = 0;
  }
  if (this->ownsLastBlock == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x3c6,"(!OwnsLastBlock())","!OwnsLastBlock()");
    if (!bVar2) {
LAB_00b384c7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  addr = &this->lastBlock;
  pBVar5 = (this->lastBlock).ptr;
  if (pBVar5 != (Block *)0x0) {
    recycler = ((((this->super_LiteralString).super_JavascriptString.super_RecyclableObject.type.ptr
                 )->javascriptLibrary).ptr)->recycler;
    pBVar5 = Block::Clone(pBVar5,(this->lastBlockInfo).charLength,recycler);
    pBVar6 = Block::Chain(pBVar5,recycler);
    pBVar5 = (pBVar6->bufferOwner).ptr;
    Memory::Recycler::WBSetBit((char *)&this->lastBlockInfo);
    (this->lastBlockInfo).buffer.ptr = pBVar5 + 1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastBlockInfo);
    (this->lastBlockInfo).charLength = pBVar6->charLength;
    (this->lastBlockInfo).charCapacity = pBVar6->charCapacity;
    this->ownsLastBlock = true;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->lastBlock).ptr = pBVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    return;
  }
  pBVar5 = BlockInfo::Resize(&this->lastBlockInfo,
                             ((((this->super_LiteralString).super_JavascriptString.
                                super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->recycler)
  ;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->lastBlock).ptr = pBVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  this->ownsLastBlock = true;
  return;
}

Assistant:

void CompoundString::TakeOwnershipOfLastBlock()
    {
        Assert(!IsFinalized());
        Assert(!OwnsLastBlock());

        // Another string object owns the last block's buffer. The buffer must be copied, or another block must be chained.

        Block *const lastBlock = this->lastBlock;
        if(!lastBlock)
        {
            // There is no last block. Only the buffer was allocated, and is held in 'lastBlockInfo'. In that case it is always
            // within the threshold to resize. Resize the buffer or resize it into a new block depending on its size.
            this->lastBlock = lastBlockInfo.Resize(GetLibrary()->GetRecycler());
            ownsLastBlock = true;
            return;
        }

        // The last block is already in a chain, or is over the threshold to resize. Shallow-clone the last block (clone
        // just its metadata, while still pointing to the original buffer), and chain it to a new last block.
        Recycler *const recycler = GetLibrary()->GetRecycler();
        Block *const newLastBlock = lastBlock->Clone(LastBlockCharLength(), recycler)->Chain(recycler);
        lastBlockInfo.CopyFrom(newLastBlock);
        ownsLastBlock = true;
        this->lastBlock = newLastBlock;
    }